

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

void __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file
          (basic_random_coro_file<(coro_io::execution_type)2> *this)

{
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *in_RDI;
  
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x1826ba);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(in_RDI);
  return;
}

Assistant:

basic_random_coro_file(coro_io::ExecutorWrapper<> *executor =
                             coro_io::get_global_block_executor())
      : basic_random_coro_file(executor->get_asio_executor()) {}